

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommonEx.cpp
# Opt level: O0

uint8_t __thiscall
GmmLib::GmmResourceInfoCommon::GetDisplayCompressionSupport(GmmResourceInfoCommon *this)

{
  GMM_RESOURCE_FORMAT GVar1;
  int iVar2;
  undefined4 extraout_var;
  PlatformInfo *pPVar3;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  bool IsSupportedMediaFormats;
  bool IsSupportedRGB32_2_10_10_10;
  bool IsSupportedRGB32_8_8_8_8;
  bool IsSupportedRGB64_16_16_16_16;
  GMM_RESOURCE_FORMAT Format;
  uint8_t ComprSupported;
  GmmResourceInfoCommon *this_local;
  
  IsSupportedRGB64_16_16_16_16 = false;
  GVar1 = (this->Surf).Format;
  if (((ulong)(this->Surf).Flags.Gpu >> 0x25 & 1) != 0) {
    local_19 = 0;
    local_1a = 0;
    local_1b = 0;
    local_1c = 0;
    if ((GVar1 == GMM_FORMAT_R16G16B16A16_FLOAT) || (GVar1 == GMM_FORMAT_R16G16B16X16_FLOAT)) {
      local_19 = 1;
    }
    if ((((GVar1 == GMM_FORMAT_A8X8_UNORM_G8R8_SNORM) || (GVar1 - GMM_FORMAT_B8G8R8A8_UNORM < 5)) ||
        (GVar1 - GMM_FORMAT_R8G8B8A8_SINT < 9)) || (GVar1 == GMM_FORMAT_X8B8_UNORM_G8R8_SNORM)) {
      local_1a = 1;
    }
    if (((GVar1 - GMM_FORMAT_B10G10R10A2_SINT < 8) ||
        (GVar1 - GMM_FORMAT_R10G10B10_FLOAT_A2_UNORM < 10)) ||
       (GVar1 == GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM)) {
      local_1b = 1;
    }
    if (((GVar1 == GMM_FORMAT_YCRCB_NORMAL) || (GVar1 == GMM_FORMAT_NV12)) ||
       (((GVar1 == GMM_FORMAT_P010 ||
         (((GVar1 == GMM_FORMAT_P016 || (GVar1 == GMM_FORMAT_Y210)) || (GVar1 == GMM_FORMAT_Y410))))
        || (GVar1 == GMM_FORMAT_Y216 || GVar1 == GMM_FORMAT_Y416)))) {
      local_1c = 1;
    }
    iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pPVar3 = Context::GetPlatformInfoObj((Context *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*pPVar3->_vptr_PlatformInfo[8])
                      (pPVar3,&this->Surf,(ulong)local_19,(ulong)local_1a,(ulong)local_1b,
                       (ulong)local_1c);
    IsSupportedRGB64_16_16_16_16 = SUB41(iVar2,0);
  }
  return IsSupportedRGB64_16_16_16_16;
}

Assistant:

uint8_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::GetDisplayCompressionSupport()
{
    uint8_t             ComprSupported = 0;
    GMM_RESOURCE_FORMAT Format         = Surf.Format;

    if(Surf.Flags.Gpu.UnifiedAuxSurface)
    {
        bool IsSupportedRGB64_16_16_16_16 = false;
        bool IsSupportedRGB32_8_8_8_8     = false;
        bool IsSupportedRGB32_2_10_10_10  = false;
        bool IsSupportedMediaFormats      = false;

        switch(Format) //RGB64 16:16 : 16 : 16 FP16
        {
            case GMM_FORMAT_R16G16B16A16_FLOAT:
            case GMM_FORMAT_R16G16B16X16_FLOAT:
                IsSupportedRGB64_16_16_16_16 = true;
            default:
                break;
        }

        switch(Format) //RGB32 8 : 8 : 8 : 8
        {
            case GMM_FORMAT_B8G8R8A8_UNORM:
            case GMM_FORMAT_R8G8B8A8_UNORM:
            case GMM_FORMAT_B8G8R8X8_UNORM:
            case GMM_FORMAT_R8G8B8X8_UNORM:
            case GMM_FORMAT_R8G8B8A8_UNORM_SRGB:
            case GMM_FORMAT_B8X8_UNORM_G8R8_SNORM:
            case GMM_FORMAT_X8B8_UNORM_G8R8_SNORM:
            case GMM_FORMAT_A8X8_UNORM_G8R8_SNORM:
            case GMM_FORMAT_B8G8R8A8_UNORM_SRGB:
            case GMM_FORMAT_B8G8R8X8_UNORM_SRGB:
            case GMM_FORMAT_R8G8B8A8_SINT:
            case GMM_FORMAT_R8G8B8A8_SNORM:
            case GMM_FORMAT_R8G8B8A8_SSCALED:
            case GMM_FORMAT_R8G8B8A8_UINT:
            case GMM_FORMAT_R8G8B8A8_USCALED:
            case GMM_FORMAT_R8G8B8X8_UNORM_SRGB:
                IsSupportedRGB32_8_8_8_8 = true;
            default:
                break;
        }

        switch(Format) //RGB32 2 : 10 : 10 : 10
        {
            case GMM_FORMAT_B10G10R10X2_UNORM:
            case GMM_FORMAT_R10G10B10A2_UNORM:
            case GMM_FORMAT_B10G10R10A2_UNORM:
            case GMM_FORMAT_B10G10R10A2_SINT:
            case GMM_FORMAT_B10G10R10A2_SNORM:
            case GMM_FORMAT_B10G10R10A2_SSCALED:
            case GMM_FORMAT_B10G10R10A2_UINT:
            case GMM_FORMAT_B10G10R10A2_UNORM_SRGB:
            case GMM_FORMAT_B10G10R10A2_USCALED:
            case GMM_FORMAT_R10G10B10_FLOAT_A2_UNORM:
            case GMM_FORMAT_R10G10B10_SNORM_A2_UNORM:
            case GMM_FORMAT_R10G10B10A2_SINT:
            case GMM_FORMAT_R10G10B10A2_SNORM:
            case GMM_FORMAT_R10G10B10A2_SSCALED:
            case GMM_FORMAT_R10G10B10A2_UINT:
            case GMM_FORMAT_R10G10B10A2_UNORM_SRGB:
            case GMM_FORMAT_R10G10B10A2_USCALED:
            case GMM_FORMAT_R10G10B10X2_USCALED:
            case GMM_FORMAT_R10G10B10_XR_BIAS_A2_UNORM:
                IsSupportedRGB32_2_10_10_10 = true;
            default:
                break;
        }

        switch(Format)
        {
            case GMM_FORMAT_YUY2: //YUV422 8 bpc
            case GMM_FORMAT_NV12: //YUV420 - NV12
            case GMM_FORMAT_P010: //YUV420 - P0xx
            case GMM_FORMAT_P016:
            case GMM_FORMAT_Y210: //YUV422 - Y210, Y212, Y216
            case GMM_FORMAT_Y216:
            case GMM_FORMAT_Y410: //YUV444 - Y410
            case GMM_FORMAT_Y416:
                IsSupportedMediaFormats = true; //YUV444 - Y412, Y416
            default:
                break;
        }

        //Check fmt is display decompressible
        ComprSupported = GetGmmLibContext()->GetPlatformInfoObj()->CheckFmtDisplayDecompressible(Surf, IsSupportedRGB64_16_16_16_16,
                                                                                                IsSupportedRGB32_8_8_8_8, IsSupportedRGB32_2_10_10_10,
                                                                                                IsSupportedMediaFormats);
    }

    return ComprSupported;
}